

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O3

void __thiscall
FIX::Session::populateRejectReason(Session *this,Message *reject,int field,string *text)

{
  pointer pcVar1;
  int iVar2;
  FieldBase *pFVar3;
  ostream *poVar4;
  stringstream stream;
  long *local_220;
  long local_218;
  long local_210 [2];
  undefined1 local_200 [16];
  _Alloc_hider local_1f0;
  char local_1e0 [16];
  _Alloc_hider local_1d0;
  size_type local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  field_metrics local_1b0;
  undefined1 local_1a8 [16];
  _Alloc_hider local_198;
  char local_188 [16];
  _Alloc_hider local_178;
  size_type local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  field_metrics local_158;
  ios_base local_128 [264];
  
  pFVar3 = FieldMap::getFieldRef(&(reject->m_header).super_FieldMap,0x23);
  iVar2 = std::__cxx11::string::compare((char *)&pFVar3->m_string);
  if ((iVar2 == 0) &&
     (iVar2 = std::__cxx11::string::compare
                        ((char *)&(this->m_sessionID).m_beginString.super_StringField.
                                  super_FieldBase.m_string), -1 < iVar2)) {
    IntField::IntField((IntField *)local_1a8,0x173,field);
    local_1a8._0_8_ = &PTR__FieldBase_001f7288;
    FieldMap::setField(&reject->super_FieldMap,(FieldBase *)local_1a8,true);
    FieldBase::~FieldBase((FieldBase *)local_1a8);
    local_1a8._0_8_ = &PTR__FieldBase_001f55c8;
    local_1a8._8_4_ = 0x3a;
    local_198._M_p = local_188;
    pcVar1 = (text->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_198,pcVar1,pcVar1 + text->_M_string_length);
    local_178._M_p = (pointer)&local_168;
    local_170 = 0;
    local_168._M_local_buf[0] = '\0';
    local_158.m_length = 0;
    local_158.m_checksum = 0;
    local_1a8._0_8_ = &PTR__FieldBase_001f7218;
    FieldMap::setField(&reject->super_FieldMap,(FieldBase *)local_1a8,true);
    FieldBase::~FieldBase((FieldBase *)local_1a8);
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_198,(text->_M_dataplus)._M_p,text->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," (",2);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,field);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
  std::__cxx11::stringbuf::str();
  local_200._0_8_ = &PTR__FieldBase_001f55c8;
  local_200._8_4_ = 0x3a;
  local_1f0._M_p = local_1e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f0,local_220,local_218 + (long)local_220);
  local_1d0._M_p = (pointer)&local_1c0;
  local_1c8 = 0;
  local_1c0._M_local_buf[0] = '\0';
  local_1b0.m_length = 0;
  local_1b0.m_checksum = 0;
  local_200._0_8_ = &PTR__FieldBase_001f7218;
  FieldMap::setField(&reject->super_FieldMap,(FieldBase *)local_200,true);
  FieldBase::~FieldBase((FieldBase *)local_200);
  if (local_220 != local_210) {
    operator_delete(local_220,local_210[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void Session::populateRejectReason(Message &reject, int field, const std::string &text) {
  auto const &msgType = reject.getHeader().getField<MsgType>();

  if (msgType == MsgType_Reject && m_sessionID.getBeginString() >= FIX::BeginString_FIX42) {
    reject.setField(RefTagID(field));
    reject.setField(Text(text));
  } else {
    std::stringstream stream;
    stream << text << " (" << field << ")";
    reject.setField(Text(stream.str()));
  }
}